

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_classes(CHAR_DATA *ch,char *argument)

{
  CClass *pCVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char buf [4608];
  
  lVar4 = 0x4f1002;
  lVar3 = 1;
  while( true ) {
    if ((race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3].name == (char *)0x0) ||
       (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3].pc_race != true)) break;
    sprintf(buf,"\n\r%s:\n\r");
    send_to_char(buf,ch);
    for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      if (*(short *)(lVar4 + lVar5 * 2) == 1) {
        pCVar1 = CClass::GetClass((int)lVar5 + 1);
        pcVar2 = RString::operator_cast_to_char_(&pCVar1->name);
        sprintf(buf,"%s ",pcVar2);
        send_to_char(buf,ch);
      }
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x88;
  }
  send_to_char("\n\r",ch);
  return;
}

Assistant:

void do_classes(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int iRace;
	int iClass;

	for (iRace = 1; race_table[iRace].name != nullptr; iRace++)
	{
		if (!race_table[iRace].pc_race)
			break;

		sprintf(buf, "\n\r%s:\n\r", race_table[iRace].name);
		send_to_char(buf, ch);

		for (iClass = 1; iClass < MAX_CLASS; iClass++)
		{
			if (pc_race_table[iRace].classes[iClass] == 1)
			{
				sprintf(buf, "%s ", (RSTR)CClass::GetClass(iClass)->name);
				send_to_char(buf, ch);
			}
		}
	}

	send_to_char("\n\r", ch);
}